

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_trait.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseTrait
          (Parser *this,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps)

{
  initializer_list<pfederc::Position> __l;
  bool bVar1;
  Token *pTVar2;
  Position *__args_3;
  Position *pos_00;
  Token **in_RDX;
  undefined1 local_130 [16];
  Position local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_108;
  vector<pfederc::Position,_std::allocator<pfederc::Position>_> local_f8;
  undefined1 local_e0 [24];
  Position *local_c8;
  Position *pos;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  functions;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_a0;
  undefined1 local_98 [16];
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  impltraits;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_70;
  undefined1 local_68 [8];
  undefined1 local_60 [8];
  Token *tokId;
  undefined1 local_40 [8];
  TemplateDecls templ;
  bool err;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps_local;
  Parser *this_local;
  
  sanityExpect((Parser *)caps,TOK_KW_TRAIT);
  templ.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
            *)local_40);
  pTVar2 = Lexer::getCurrentToken
                     ((Lexer *)(caps->_M_t).
                               super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                               .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
  bVar1 = Token::operator==(pTVar2,TOK_OP_TEMPL_BRACKET_OPEN);
  if (bVar1) {
    parseTemplateDecl((TemplateDecls *)&tokId,(Parser *)caps);
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::operator=((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                 *)local_40,
                (vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                 *)&tokId);
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::~vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
               *)&tokId);
  }
  local_60 = (undefined1  [8])
             Lexer::getCurrentToken
                       ((Lexer *)(caps->_M_t).
                                 super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                 .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl
                       );
  bVar1 = expect((Parser *)caps,TOK_ID);
  if (!bVar1) {
    impltraits.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 2;
    impltraits.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 8;
    Token::getPosition((Token *)local_60);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&local_70,
               (SyntaxErrorCode *)
               ((long)&impltraits.
                       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),
               (Position *)
               &impltraits.
                super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    generateError((Parser *)local_68,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)caps);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_68)
    ;
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr(&local_70);
    templ.
    super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  }
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
            *)(local_98 + 8));
  pTVar2 = Lexer::getCurrentToken
                     ((Lexer *)(caps->_M_t).
                               super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                               .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
  bVar1 = Token::operator==(pTVar2,TOK_OP_DCL);
  if (bVar1) {
    Lexer::next((Lexer *)(caps->_M_t).
                         super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                         .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
    parseTraitImpl((Parser *)caps,
                   (bool *)((long)&templ.
                                   super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                   (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    *)(local_98 + 8));
  }
  bVar1 = expect((Parser *)caps,TOK_EOL);
  if (!bVar1) {
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node._M_size._6_2_ = 2;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node._M_size._0_4_ = 0xf;
    pTVar2 = Lexer::getCurrentToken
                       ((Lexer *)(caps->_M_t).
                                 super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                 .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl
                       );
    Token::getPosition(pTVar2);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&local_a0,
               (SyntaxErrorCode *)
               ((long)&functions.
                       super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                       ._M_impl._M_node._M_size + 6),
               (Position *)
               &functions.
                super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                ._M_impl._M_node._M_size);
    generateError((Parser *)local_98,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)caps);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_98)
    ;
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr(&local_a0);
  }
  std::__cxx11::
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ::list((list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *)&pos);
  parseTraitBody((Parser *)caps,
                 (bool *)((long)&templ.
                                 super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                 (list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                  *)&pos);
  pTVar2 = Lexer::getCurrentToken
                     ((Lexer *)(caps->_M_t).
                               super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                               .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
  local_c8 = Token::getPosition(pTVar2);
  bVar1 = expect((Parser *)caps,TOK_STMT);
  if (!bVar1) {
    local_e0._6_2_ = 2;
    local_e0._0_4_ = 0xc;
    pTVar2 = Lexer::getCurrentToken
                       ((Lexer *)(caps->_M_t).
                                 super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                 .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl
                       );
    __args_3 = Token::getPosition(pTVar2);
    pos_00 = Token::getPosition((Token *)local_60);
    Position::Position(&local_120,pos_00);
    local_108._8_8_ = 1;
    local_108._M_allocated_capacity = (size_type)&local_120;
    std::allocator<pfederc::Position>::allocator((allocator<pfederc::Position> *)(local_130 + 0xf));
    __l._M_len = local_108._8_8_;
    __l._M_array = (iterator)local_108._M_allocated_capacity;
    std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
              (&local_f8,__l,(allocator<pfederc::Position> *)(local_130 + 0xf));
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&,std::vector<pfederc::Position,std::allocator<pfederc::Position>>>
              ((Level *)(local_e0 + 8),(SyntaxErrorCode *)(local_e0 + 6),(Position *)local_e0,
               (vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)__args_3);
    generateError((Parser *)(local_e0 + 0x10),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)caps);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_e0 + 0x10));
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)(local_e0 + 8));
    std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::~vector(&local_f8);
    std::allocator<pfederc::Position>::~allocator((allocator<pfederc::Position> *)(local_130 + 0xf))
    ;
  }
  if ((templ.
       super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::
    make_unique<pfederc::TraitExpr,pfederc::Lexer&,pfederc::Position_const&,std::unique_ptr<pfederc::Capabilities,std::default_delete<pfederc::Capabilities>>,pfederc::Token_const*const&,std::vector<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>,std::allocator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>>>,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,std::__cxx11::list<std::unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>>,std::allocator<std::unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>>>>>
              ((Lexer *)local_130,
               (Position *)
               (caps->_M_t).
               super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
               ._M_t.
               super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
               .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl,
               (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)
               local_c8,in_RDX,
               (vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                *)local_60,
               (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                *)local_40,
               (list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                *)(local_98 + 8));
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<pfederc::TraitExpr,std::default_delete<pfederc::TraitExpr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
               (unique_ptr<pfederc::TraitExpr,_std::default_delete<pfederc::TraitExpr>_> *)local_130
              );
    std::unique_ptr<pfederc::TraitExpr,_std::default_delete<pfederc::TraitExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::TraitExpr,_std::default_delete<pfederc::TraitExpr>_> *)local_130
              );
  }
  else {
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<std::default_delete<pfederc::Expr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0);
  }
  local_130._8_4_ = 1;
  std::__cxx11::
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ::~list((list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
           *)&pos);
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             *)(local_98 + 8));
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::~vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
             *)local_40);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseTrait(std::unique_ptr<Capabilities> &&caps) noexcept {
  sanityExpect(TokenType::TOK_KW_TRAIT);

  bool err = false; // hard errors

  TemplateDecls templ;
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_TEMPL_BRACKET_OPEN) {
    templ = parseTemplateDecl();
    // maybe soft error
  }

  const Token *const tokId = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_ID, tokId->getPosition()));
    err = true;
  }

  std::vector<std::unique_ptr<Expr>> impltraits;
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_DCL) {
    lexer.next(); // eat :
    parseTraitImpl(err, impltraits);
  }

  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
  }
  // trait body: funtions
  std::list<std::unique_ptr<FuncExpr>> functions;
  parseTraitBody(err, functions);

  const Position &pos = lexer.getCurrentToken()->getPosition();
  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition(),
      std::vector<Position> { tokId->getPosition() }));
  }

  if (err)
    return nullptr;

  return std::make_unique<TraitExpr>(lexer, pos, std::move(caps),
      tokId, std::move(templ),
      std::move(impltraits), std::move(functions));
}